

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

NTRUKeyPair * ntru_keygen_attempt(uint p,uint q,uint w)

{
  ulong factor1;
  uint uVar1;
  mp_int *pmVar2;
  uint16_t *in;
  mp_int *x;
  uintmax_t uVar3;
  uint16_t *out;
  uint16_t *v;
  uint16_t *out_00;
  uint16_t *out_01;
  uint16_t *out_02;
  uint16_t *out_03;
  uint16_t *v_00;
  NTRUKeyPair *pNVar4;
  size_t i;
  ulong uVar5;
  ulong bits;
  
  factor1 = (ulong)p;
  bits = (ulong)(p * 2 + 0x80);
  pmVar2 = mp_random_bits_fn(bits,random_read);
  pmVar2 = mp_resize(pmVar2,bits + 0x20);
  in = (uint16_t *)safemalloc(factor1,2,0);
  x = mp_new(0x40);
  for (uVar5 = 0; factor1 != uVar5; uVar5 = uVar5 + 1) {
    mp_mul_integer_into(pmVar2,pmVar2,3);
    mp_rshift_fixed_into(x,pmVar2,bits);
    mp_reduce_mod_2to(pmVar2,bits);
    uVar3 = mp_get_integer(x);
    in[uVar5] = (uint16_t)uVar3;
  }
  mp_free(x);
  mp_free(pmVar2);
  pNVar4 = (NTRUKeyPair *)0x0;
  out = (uint16_t *)safemalloc(factor1,2,0);
  uVar1 = ntru_ring_invert(out,in,p,3);
  if (uVar1 != 0) {
    v = (uint16_t *)safemalloc(factor1,2,0);
    ntru_gen_short(v,p,w);
    ntru_expand(v,v,p,q);
    out_00 = (uint16_t *)safemalloc(factor1,2,0);
    ntru_scale(out_00,v,3,p,q);
    out_01 = (uint16_t *)safemalloc(factor1,2,0);
    uVar1 = ntru_ring_invert(out_01,out_00,p,q);
    if (uVar1 == 0) {
      ring_free(v,p);
      pNVar4 = (NTRUKeyPair *)0x0;
    }
    else {
      out_02 = (uint16_t *)safemalloc(factor1,2,0);
      ntru_expand(out_02,in,p,q);
      out_03 = (uint16_t *)safemalloc(factor1,2,0);
      ntru_ring_multiply(out_03,out_02,out_01,p,q);
      v_00 = (uint16_t *)safemalloc(factor1,2,0);
      ntru_gen_short(v_00,p,w);
      pNVar4 = (NTRUKeyPair *)safemalloc(1,0x30,0);
      pNVar4->p = p;
      pNVar4->q = q;
      pNVar4->w = w;
      pNVar4->h = out_03;
      pNVar4->f3 = out_00;
      pNVar4->ginv = out;
      pNVar4->rho = v_00;
      out = out_02;
      out_00 = v;
    }
    ring_free(out_00,p);
    ring_free(out_01,p);
  }
  ring_free(in,p);
  ring_free(out,p);
  return pNVar4;
}

Assistant:

NTRUKeyPair *ntru_keygen_attempt(unsigned p, unsigned q, unsigned w)
{
    /*
     * First invent g, which is the one more likely to fail to invert.
     * This is simply a uniformly random polynomial with p terms over
     * Z_3. So we need p*log2(3) random bits for it, plus 128 for
     * uniformity. It's easiest to bound log2(3) above by 2.
     */
    size_t randbitpos = 2 * p + 128;
    mp_int *randdata = mp_resize(mp_random_bits(randbitpos), randbitpos + 32);

    /*
     * Select p random values from {0,1,2}.
     */
    uint16_t *g = snewn(p, uint16_t);
    mp_int *x = mp_new(64);
    for (size_t i = 0; i < p; i++) {
        mp_mul_integer_into(randdata, randdata, 3);
        mp_rshift_fixed_into(x, randdata, randbitpos);
        mp_reduce_mod_2to(randdata, randbitpos);
        g[i] = mp_get_integer(x);
    }
    mp_free(x);
    mp_free(randdata);

    /*
     * Try to invert g over Z_3, and fail if it isn't invertible.
     */
    uint16_t *ginv = snewn(p, uint16_t);
    if (!ntru_ring_invert(ginv, g, p, 3)) {
        ring_free(g, p);
        ring_free(ginv, p);
        return NULL;
    }

    /*
     * Fine; we have g. Now make up an f, and convert it to a
     * polynomial over q.
     */
    uint16_t *f = snewn(p, uint16_t);
    ntru_gen_short(f, p, w);
    ntru_expand(f, f, p, q);

    /*
     * Multiply f by 3.
     */
    uint16_t *f3 = snewn(p, uint16_t);
    ntru_scale(f3, f, 3, p, q);

    /*
     * Try to invert 3*f over Z_q. This should be _almost_ guaranteed
     * to succeed, since Z_q/<x^p-x-1> is a field, so the only
     * non-invertible value is 0. Even so, there _is_ one, so check
     * the return value!
     */
    uint16_t *f3inv = snewn(p, uint16_t);
    if (!ntru_ring_invert(f3inv, f3, p, q)) {
        ring_free(f, p);
        ring_free(f3, p);
        ring_free(f3inv, p);
        ring_free(g, p);
        ring_free(ginv, p);
        return NULL;
    }

    /*
     * Make the public key, by converting g to a polynomial over q and
     * then multiplying by f3inv.
     */
    uint16_t *g_q = snewn(p, uint16_t);
    ntru_expand(g_q, g, p, q);
    uint16_t *h = snewn(p, uint16_t);
    ntru_ring_multiply(h, g_q, f3inv, p, q);

    /*
     * Make up rho, used to substitute for the plaintext in the
     * session hash in case of confirmation failure.
     */
    uint16_t *rho = snewn(p, uint16_t);
    ntru_gen_short(rho, p, w);

    /*
     * And we're done! Free everything except the pieces we're
     * returning.
     */
    NTRUKeyPair *keypair = snew(NTRUKeyPair);
    keypair->p = p;
    keypair->q = q;
    keypair->w = w;
    keypair->h = h;
    keypair->f3 = f3;
    keypair->ginv = ginv;
    keypair->rho = rho;
    ring_free(f, p);
    ring_free(f3inv, p);
    ring_free(g, p);
    ring_free(g_q, p);
    return keypair;
}